

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dir.c
# Opt level: O0

int TIFFUnsetField(TIFF *tif,uint32_t tag)

{
  undefined4 uVar1;
  TIFFField *pTVar2;
  TIFFTagValue *pTVar3;
  uint uVar4;
  TIFFTagValue *pTVar5;
  int local_3c;
  TIFFTagValue *pTStack_38;
  int i;
  TIFFTagValue *tv;
  TIFFDirectory *td;
  TIFFField *fip;
  uint32_t tag_local;
  TIFF *tif_local;
  
  pTVar2 = TIFFFieldWithTag(tif,tag);
  if (pTVar2 == (TIFFField *)0x0) {
    tif_local._4_4_ = 0;
  }
  else {
    if (pTVar2->field_bit == 0x41) {
      pTStack_38 = (TIFFTagValue *)0x0;
      local_3c = 0;
      while ((local_3c < (tif->tif_dir).td_customValueCount &&
             (pTStack_38 = (tif->tif_dir).td_customValues + local_3c,
             pTStack_38->info->field_tag != tag))) {
        local_3c = local_3c + 1;
      }
      if (local_3c < (tif->tif_dir).td_customValueCount) {
        _TIFFfreeExt(tif,pTStack_38->value);
        for (; local_3c < (tif->tif_dir).td_customValueCount + -1; local_3c = local_3c + 1) {
          pTVar3 = (tif->tif_dir).td_customValues + local_3c;
          pTVar5 = (tif->tif_dir).td_customValues + (local_3c + 1);
          pTVar3->info = pTVar5->info;
          uVar1 = *(undefined4 *)&pTVar5->field_0xc;
          pTVar3->count = pTVar5->count;
          *(undefined4 *)&pTVar3->field_0xc = uVar1;
          pTVar3->value = pTVar5->value;
        }
        (tif->tif_dir).td_customValueCount = (tif->tif_dir).td_customValueCount + -1;
      }
    }
    else {
      uVar4 = pTVar2->field_bit / 0x20;
      (tif->tif_dir).td_fieldsset[(int)uVar4] =
           (1 << ((byte)pTVar2->field_bit & 0x1f) ^ 0xffffffffU) &
           (tif->tif_dir).td_fieldsset[(int)uVar4];
    }
    tif->tif_flags = tif->tif_flags | 8;
    tif_local._4_4_ = 1;
  }
  return tif_local._4_4_;
}

Assistant:

int TIFFUnsetField(TIFF *tif, uint32_t tag)
{
    const TIFFField *fip = TIFFFieldWithTag(tif, tag);
    TIFFDirectory *td = &tif->tif_dir;

    if (!fip)
        return 0;

    if (fip->field_bit != FIELD_CUSTOM)
        TIFFClrFieldBit(tif, fip->field_bit);
    else
    {
        TIFFTagValue *tv = NULL;
        int i;

        for (i = 0; i < td->td_customValueCount; i++)
        {

            tv = td->td_customValues + i;
            if (tv->info->field_tag == tag)
                break;
        }

        if (i < td->td_customValueCount)
        {
            _TIFFfreeExt(tif, tv->value);
            for (; i < td->td_customValueCount - 1; i++)
            {
                td->td_customValues[i] = td->td_customValues[i + 1];
            }
            td->td_customValueCount--;
        }
    }

    tif->tif_flags |= TIFF_DIRTYDIRECT;

    return (1);
}